

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsRecover2(octet *s,size_t count,size_t len,octet *si)

{
  size_t m;
  word *stack;
  u64 *dest;
  word *d;
  word *da;
  word *db;
  u64 *dest_00;
  word *c;
  octet oVar1;
  long lVar2;
  long lVar3;
  bool_t bVar4;
  int iVar5;
  octet *poVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  u64 *dest_01;
  ulong uVar14;
  ulong n;
  long lVar15;
  ulong uVar16;
  size_t n_00;
  size_t sVar17;
  word *b;
  octet *poVar18;
  err_t eVar19;
  ulong n_01;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  long local_98;
  
  eVar19 = 0x6d;
  if ((0xffffffffffffffef < count - 0x11) && (len == 0x20 || (len & 0xfffffffffffffff7) == 0x10)) {
    uVar16 = len | 1;
    bVar4 = memIsValid(si,uVar16 * count);
    if ((bVar4 != 0) && (bVar4 = memIsValid(s,len), bVar4 != 0)) {
      poVar6 = si + uVar16;
      uVar14 = 0;
      while (uVar14 != count) {
        lVar15 = uVar14 * uVar16;
        if ((byte)(si[lVar15] - 0x11) < 0xf0) {
          return 0x1f9;
        }
        uVar20 = uVar14 + 1;
        poVar18 = poVar6;
        while (uVar14 = uVar14 + 1, uVar14 < count) {
          oVar1 = *poVar18;
          poVar18 = poVar18 + uVar16;
          if (si[lVar15] == oVar1) {
            return 0x1f9;
          }
        }
        poVar6 = poVar6 + uVar16;
        uVar14 = uVar20;
      }
      n_01 = len >> 3;
      sVar7 = ppMul_deep(n_01,n_01);
      n_00 = n_01 * count;
      m = n_01 + 1;
      sVar8 = ppMod_deep(n_00,m);
      sVar8 = utilMax(2,sVar7,sVar8);
      n = len >> 2;
      lVar15 = count - 1;
      sVar7 = n_01 * 3;
      sVar17 = n | 1;
      uVar14 = n_01;
      uVar20 = n;
      while (bVar22 = lVar15 != 0, lVar15 = lVar15 + -1, bVar22) {
        sVar9 = ppExGCD_deep(m,uVar14 + 1);
        sVar10 = ppMul_deep(uVar14,uVar14);
        sVar11 = ppMul_deep(uVar20,n_01);
        sVar12 = ppMul_deep(n,uVar14);
        sVar13 = ppMod_deep(sVar7,sVar17);
        sVar8 = utilMax(6,sVar8,sVar9,sVar10,sVar11,sVar12,sVar13);
        sVar7 = sVar7 + n;
        uVar20 = uVar20 + n;
        uVar14 = uVar14 + n_01;
        sVar17 = sVar17 + n_01;
      }
      local_98 = count - 1;
      lVar21 = n_01 * local_98;
      lVar15 = (count * 2 + -1) * n_01;
      uVar20 = (count * 2 + -2) * n_01;
      uVar14 = (count + 1) * n_01;
      if (uVar14 <= uVar20 && uVar20 - uVar14 != 0) {
        uVar14 = uVar20;
      }
      dest_01 = (u64 *)blobCreate(sVar8 + lVar21 * 0x10 + (n_01 + n_00 + m + lVar15 + uVar14) * 8 +
                                  0x20);
      if (dest_01 == (u64 *)0x0) {
        eVar19 = 0x6e;
      }
      else {
        dest = (u64 *)((long)dest_01 + len + 8);
        lVar2 = n_00 * 8 + len + 8;
        d = (word *)((long)dest_01 + n_00 * 8 + len + 0x10);
        lVar3 = lVar21 * 8 + lVar2 + 8;
        da = (word *)((long)dest_01 + lVar21 * 8 + lVar2 + 0x10);
        lVar2 = lVar21 * 8 + lVar3 + 8;
        db = (word *)((long)dest_01 + lVar21 * 8 + lVar3 + 0x10);
        lVar21 = len + 8 + lVar2;
        dest_00 = (u64 *)((long)dest_01 + len + 0x10 + lVar2);
        c = (word *)((long)dest_01 + lVar15 * 8 + lVar21 + 8);
        stack = c + uVar14;
        u64From(dest_00,si + 1,len);
        belsStdM((octet *)dest,len,(ulong)*si);
        u64From(dest,dest,len);
        *(undefined8 *)((long)dest_01 + len * 2 + 8) = 1;
        *(undefined8 *)((long)dest_01 + len) = 1;
        lVar15 = n_01 * 2;
        poVar6 = si + len + 2;
        b = (word *)((long)dest_01 + (count * 0x28 + -0x10) * n_01 + len * 2 + 0x28);
        sVar7 = 0;
        sVar8 = 0;
        while (bVar22 = local_98 != 0, local_98 = local_98 + -1, bVar22) {
          belsStdM((octet *)dest_01,len,(ulong)poVar6[-1]);
          u64From(dest_01,dest_01,len);
          sVar17 = n_01 + sVar8 + 1;
          ppExGCD(d,da,db,dest_01,m,dest,sVar17,stack);
          iVar5 = wwCmpW(d,sVar17,1);
          if (iVar5 != 0) {
            eVar19 = 0x1f9;
            goto LAB_0011794e;
          }
          sVar17 = n_01 + sVar8;
          ppMul(c,da,sVar17,dest_00,sVar17,stack);
          sVar9 = lVar15 + sVar7;
          ppMul(dest_00,c,sVar9,dest_01,n_01,stack);
          wwXor2((word *)((long)dest_01 + len + 8 + lVar21),c,sVar9);
          u64From(c,poVar6,len);
          ppMul(d,db,n_01,c,n_01,stack);
          ppMul(c,d,n,dest,sVar17,stack);
          wwXor2(b,d,n);
          wwXor2(dest_00,c,n_01 * 3 + sVar8);
          ppMul(c,dest_01,n_01,dest,sVar17,stack);
          wwXor2((word *)((long)c + len),dest,sVar17);
          wwXor2(b,dest_01,n_01);
          wwCopy(dest,c,lVar15 + sVar8);
          *(undefined8 *)((long)dest_01 + sVar8 * 8 + n_01 * 0x10 + len + 8) = 1;
          ppMod(dest_00,dest_00,sVar7 + n_01 * 3,dest,lVar15 + sVar8 + 1,stack);
          poVar6 = poVar6 + uVar16;
          b = b + n_01;
          sVar7 = sVar9;
          sVar8 = sVar17;
        }
        eVar19 = 0;
        belsStdM((octet *)dest_01,len,0);
        u64From(dest_01,dest_01,len);
        *(undefined8 *)((long)dest_01 + len) = 1;
        ppMod(dest_00,dest_00,n_00,dest_01,m,stack);
        u64To(s,len,dest_00);
LAB_0011794e:
        blobClose(dest_01);
      }
    }
  }
  return eVar19;
}

Assistant:

err_t belsRecover2(octet s[], size_t count, size_t len, const octet si[])
{
	size_t n, i, j, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || count > 16 ||
		!memIsValid(si, count * (len + 1)) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	// проверить номера частичных секретов
	for (i = 0; i < count; ++i)
	{
		if (si[i * (len + 1)] == 0 || si[i * (len + 1)] > 16)
			return ERR_BAD_PUBKEY;
		for (j = i + 1; j < count; ++j)
			if (si[i * (len + 1)] == si[j * (len + 1)])
				return ERR_BAD_PUBKEY;
	}
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2,
		ppMul_deep(n, n),
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6,
			deep,
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n +
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si + 1, len);
	// [n + 1]g(x) <- x^l + m1(x)
	belsStdM((octet*)g, len, si[0]);
	wwFrom(g, g, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		belsStdM((octet*)f, len, si[i * (len + 1)]);
		wwFrom(f, f, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * (len + 1) + 1, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	belsStdM((octet*)f, len, 0);
	wwFrom(f, f, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}